

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PidAt
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,size_t iecpMin,size_t iecpLim)

{
  code *pcVar1;
  bool bVar2;
  uint32 cch;
  undefined4 *puVar3;
  EncodedCharPtr puVar4;
  IdentPtr pIVar5;
  ulong uVar6;
  
  puVar4 = this->m_pchBase;
  uVar6 = (long)this->m_pchLast - (long)puVar4;
  if ((uVar6 <= iecpMin) || (iecpLim <= iecpMin || uVar6 < iecpLim)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x21f,
                       "(iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin)"
                       ,
                       "iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    puVar4 = this->m_pchBase;
  }
  cch = UnescapeToTempBuf(this,puVar4 + iecpMin,puVar4 + iecpLim);
  pIVar5 = HashTbl::PidHashNameLen<char16_t>(&this->m_htbl,(this->m_tempChBuf).m_prgch,cch);
  return pIVar5;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::PidAt(size_t iecpMin, size_t iecpLim)
{
    Assert(iecpMin < AdjustedLength() && iecpLim <= AdjustedLength() && iecpLim > iecpMin);
    return PidOfIdentiferAt(m_pchBase + iecpMin, m_pchBase + iecpLim);
}